

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

object * __thiscall
jessilib::json_parser::deserialize_bytes
          (object *__return_storage_ptr__,json_parser *this,bytes_view_type in_data,
          text_encoding in_write_encoding)

{
  allocator<char16_t> *this_00;
  allocator<char32_t> *this_01;
  char16_t *begin;
  char16_t *pcVar1;
  size_type sVar2;
  char32_t *begin_00;
  char32_t *pcVar3;
  size_type sVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar5;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> bVar6;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> bVar7;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar8;
  basic_string_view<char,_std::char_traits<char>_> in_mbstring;
  undefined1 local_158 [8];
  u32string_view data_view_6;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_140;
  undefined1 local_130 [8];
  u32string u32_data;
  u16string_view data_view_5;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_f8;
  undefined1 local_e8 [8];
  u16string u16_data;
  u8string_view data_view_4;
  undefined1 local_a8 [8];
  pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  u8_data;
  wstring_view data_view_3;
  u32string_view data_view_2;
  u16string_view data_view_1;
  undefined1 local_40 [8];
  u8string_view data_view;
  text_encoding in_write_encoding_local;
  json_parser *this_local;
  bytes_view_type in_data_local;
  object *result;
  
  in_data_local._M_len = (size_t)in_data._M_str;
  this_local = (json_parser *)in_data._M_len;
  data_view._M_str._3_1_ = 0;
  data_view._M_str._4_4_ = in_write_encoding;
  in_data_local._M_str = (char *)__return_storage_ptr__;
  object::object(__return_storage_ptr__);
  if (data_view._M_str._4_4_ == utf_8) {
    bVar5 = string_view_cast<char8_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    data_view._M_len = (size_t)bVar5._M_str;
    local_40 = (undefined1  [8])bVar5._M_len;
    deserialize_json<char8_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_40);
  }
  else if (data_view._M_str._4_4_ == utf_16) {
    bVar6 = string_view_cast<char16_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    data_view_2._M_str = (char32_t *)bVar6._M_len;
    deserialize_json<char16_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&data_view_2._M_str);
  }
  else if (data_view._M_str._4_4_ == utf_32) {
    bVar7 = string_view_cast<char32_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    data_view_2._M_len = (size_t)bVar7._M_str;
    data_view_3._M_str = (wchar_t *)bVar7._M_len;
    deserialize_json<char32_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&data_view_3._M_str);
  }
  else if (data_view._M_str._4_4_ == wchar) {
    bVar8 = string_view_cast<wchar_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    data_view_3._M_len = (size_t)bVar8._M_str;
    u8_data.second.field_2._8_8_ = bVar8._M_len;
    deserialize_json<wchar_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
               ((long)&u8_data.second.field_2 + 8));
  }
  else if (data_view._M_str._4_4_ == multibyte) {
    in_mbstring = string_view_cast<char,std::basic_string_view<char,std::char_traits<char>>>
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    mbstring_to_ustring<char8_t>
              ((pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                *)local_a8,in_mbstring);
    join_0x00000010_0x00000000_ =
         std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&u8_data);
    deserialize_json<char8_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
               ((long)&u16_data.field_2 + 8));
    std::
    pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
    ::~pair((pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
             *)local_a8);
  }
  else if (data_view._M_str._4_4_ == utf_16_big) {
    local_f8 = string_view_cast<char16_t,std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    this_00 = (allocator<char16_t> *)((long)&data_view_5._M_str + 7);
    std::allocator<char16_t>::allocator(this_00);
    std::__cxx11::u16string::
    u16string<std::basic_string_view<char16_t,std::char_traits<char16_t>>,void>
              ((u16string *)local_e8,&local_f8,this_00);
    std::allocator<char16_t>::~allocator((allocator<char16_t> *)((long)&data_view_5._M_str + 7));
    begin = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::data
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)local_e8);
    pcVar1 = std::__cxx11::
             basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::data
                       ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                         *)local_e8);
    sVar2 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)local_e8);
    array_byteswap<char16_t>(begin,pcVar1 + sVar2);
    join_0x00000010_0x00000000_ =
         std::__cxx11::u16string::operator_cast_to_basic_string_view((u16string *)local_e8);
    deserialize_json<char16_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
               ((long)&u32_data.field_2 + 8));
    std::__cxx11::u16string::~u16string((u16string *)local_e8);
  }
  else if (data_view._M_str._4_4_ == utf_32_big) {
    local_140 = string_view_cast<char32_t,std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    this_01 = (allocator<char32_t> *)((long)&data_view_6._M_str + 7);
    std::allocator<char32_t>::allocator(this_01);
    std::__cxx11::u32string::
    u32string<std::basic_string_view<char32_t,std::char_traits<char32_t>>,void>
              ((u32string *)local_130,&local_140,this_01);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)((long)&data_view_6._M_str + 7));
    begin_00 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::data
                         ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)local_130);
    pcVar3 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::data
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_130);
    sVar4 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)local_130);
    array_byteswap<char32_t>(begin_00,pcVar3 + sVar4);
    _local_158 = std::__cxx11::u32string::operator_cast_to_basic_string_view((u32string *)local_130)
    ;
    deserialize_json<char32_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_158);
    std::__cxx11::u32string::~u32string((u32string *)local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

object json_parser::deserialize_bytes(bytes_view_type in_data, text_encoding in_write_encoding) {
	object result;

	if (in_write_encoding == text_encoding::utf_8) {
		std::u8string_view data_view = jessilib::string_view_cast<char8_t>(in_data);
		deserialize_json<char8_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_16) {
		std::u16string_view data_view = jessilib::string_view_cast<char16_t>(in_data);
		deserialize_json<char16_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_32) {
		std::u32string_view data_view = jessilib::string_view_cast<char32_t>(in_data);
		deserialize_json<char32_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::wchar) {
		std::wstring_view data_view = jessilib::string_view_cast<wchar_t>(in_data);
		deserialize_json<wchar_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::multibyte) {
		// TODO: support without copying
		auto u8_data = mbstring_to_ustring<char8_t>(jessilib::string_view_cast<char>(in_data));
		std::u8string_view data_view = u8_data.second;
		deserialize_json<char8_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_16_foreign) {
		// TODO: support without copying
		std::u16string u16_data{ jessilib::string_view_cast<char16_t>(in_data) };
		array_byteswap(u16_data.data(), u16_data.data() + u16_data.size());
		std::u16string_view data_view = u16_data;

		deserialize_json<char16_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_32_foreign) {
		// TODO: support without copying
		std::u32string u32_data{ jessilib::string_view_cast<char32_t>(in_data) };
		array_byteswap(u32_data.data(), u32_data.data() + u32_data.size());
		std::u32string_view data_view = u32_data;

		deserialize_json<char32_t, true>(result, data_view);
	}

	return result;
}